

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolk.c
# Opt level: O0

int ffpprk(fitsfile *fptr,long group,LONGLONG firstelem,LONGLONG nelem,int *array,int *status)

{
  int iVar1;
  int *in_R9;
  int nullvalue;
  long row;
  void *in_stack_000000e8;
  int in_stack_000000f4;
  LONGLONG in_stack_000000f8;
  LONGLONG in_stack_00000100;
  int in_stack_0000010c;
  fitsfile *in_stack_00000110;
  void *in_stack_00000140;
  int *in_stack_00000148;
  int *in_stack_00007220;
  LONGLONG in_stack_00007228;
  LONGLONG in_stack_00007230;
  LONGLONG in_stack_00007238;
  int in_stack_00007244;
  fitsfile *in_stack_00007248;
  int *in_stack_00007290;
  fitsfile *in_stack_ffffffffffffff98;
  int local_4;
  
  iVar1 = fits_is_compressed_image(in_stack_ffffffffffffff98,(int *)0x230f51);
  if (iVar1 == 0) {
    ffpclk(in_stack_00007248,in_stack_00007244,in_stack_00007238,in_stack_00007230,in_stack_00007228
           ,in_stack_00007220,in_stack_00007290);
    local_4 = *in_R9;
  }
  else {
    fits_write_compressed_pixels
              (in_stack_00000110,in_stack_0000010c,in_stack_00000100,in_stack_000000f8,
               in_stack_000000f4,in_stack_000000e8,in_stack_00000140,in_stack_00000148);
    local_4 = *in_R9;
  }
  return local_4;
}

Assistant:

int ffpprk( fitsfile *fptr,  /* I - FITS file pointer                       */
            long  group,     /* I - group to write(1 = 1st group)           */
            LONGLONG  firstelem, /* I - first vector element to write(1 = 1st)  */
            LONGLONG  nelem,     /* I - number of values to write               */
            int   *array,    /* I - array of values that are written        */
            int  *status)    /* IO - error status                           */
/*
  Write an array of values to the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being written).
*/
{
    long row;
    int nullvalue;

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        fits_write_compressed_pixels(fptr, TINT, firstelem, nelem,
            0, array, &nullvalue, status);
        return(*status);
    }

    row=maxvalue(1,group);

    ffpclk(fptr, 2, row, firstelem, nelem, array, status);
    return(*status);
}